

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShoppingRushSolution.cpp
# Opt level: O0

int shopping<std::multiset<std::pair<ToyStoreProduct,int>,std::less<std::pair<ToyStoreProduct,int>>,std::allocator<std::pair<ToyStoreProduct,int>>>>
              (timed_mutex *buy_mx,
              multiset<std::pair<ToyStoreProduct,_int>,_std::less<std::pair<ToyStoreProduct,_int>_>,_std::allocator<std::pair<ToyStoreProduct,_int>_>_>
              *shop,string *shopname,int *budget,int threadid)

{
  bool bVar1;
  int iVar2;
  reference ppVar3;
  type *ptVar4;
  ostream *poVar5;
  _Rb_tree_const_iterator<std::pair<ToyStoreProduct,_int>_> local_80;
  iterator elit;
  size_t size;
  int local_5c;
  duration<long,_std::ratio<1L,_1000L>_> local_58 [2];
  undefined1 local_48 [8];
  unique_lock<std::timed_mutex> buy_lock;
  bool checkout;
  int threadid_local;
  int *budget_local;
  string *shopname_local;
  multiset<std::pair<ToyStoreProduct,_int>,_std::less<std::pair<ToyStoreProduct,_int>_>,_std::allocator<std::pair<ToyStoreProduct,_int>_>_>
  *shop_local;
  timed_mutex *buy_mx_local;
  
  buy_lock._11_1_ = 0;
  buy_lock._12_4_ = threadid;
  do {
    if (((buy_lock._11_1_ ^ 0xff) & 1) == 0) {
      return 0;
    }
    std::unique_lock<std::timed_mutex>::unique_lock
              ((unique_lock<std::timed_mutex> *)local_48,buy_mx);
    local_5c = 100;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)local_58,&local_5c);
    bVar1 = std::unique_lock<std::timed_mutex>::try_lock_for<long,std::ratio<1l,1000l>>
                      ((unique_lock<std::timed_mutex> *)local_48,local_58);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      elit._M_node = (_Base_ptr)
                     std::
                     multiset<std::pair<ToyStoreProduct,_int>,_std::less<std::pair<ToyStoreProduct,_int>_>,_std::allocator<std::pair<ToyStoreProduct,_int>_>_>
                     ::size(shop);
      if (elit._M_node == (_Base_ptr)0x0) {
        poVar5 = std::operator<<((ostream *)&std::cout,"[T ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,buy_lock._12_4_);
        poVar5 = std::operator<<(poVar5,"] no more products in this shop");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        buy_lock._11_1_ = 1;
      }
      else {
        local_80._M_node =
             (_Base_ptr)
             std::
             multiset<std::pair<ToyStoreProduct,_int>,_std::less<std::pair<ToyStoreProduct,_int>_>,_std::allocator<std::pair<ToyStoreProduct,_int>_>_>
             ::begin(shop);
        iVar2 = rand();
        std::advance<std::_Rb_tree_const_iterator<std::pair<ToyStoreProduct,int>>,unsigned_long>
                  (&local_80,(ulong)(long)iVar2 % (ulong)elit._M_node);
        ppVar3 = std::_Rb_tree_const_iterator<std::pair<ToyStoreProduct,_int>_>::operator*
                           (&local_80);
        ptVar4 = std::get<1ul,ToyStoreProduct,int>(ppVar3);
        if (*ptVar4 < *budget) {
          ppVar3 = std::_Rb_tree_const_iterator<std::pair<ToyStoreProduct,_int>_>::operator*
                             (&local_80);
          ptVar4 = std::get<1ul,ToyStoreProduct,int>(ppVar3);
          *budget = *budget - *ptVar4;
          std::
          multiset<std::pair<ToyStoreProduct,int>,std::less<std::pair<ToyStoreProduct,int>>,std::allocator<std::pair<ToyStoreProduct,int>>>
          ::erase_abi_cxx11_((multiset<std::pair<ToyStoreProduct,int>,std::less<std::pair<ToyStoreProduct,int>>,std::allocator<std::pair<ToyStoreProduct,int>>>
                              *)shop,(const_iterator)local_80._M_node);
          poVar5 = std::operator<<((ostream *)&std::cout,"[T ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,buy_lock._12_4_);
          poVar5 = std::operator<<(poVar5,", ");
          poVar5 = std::operator<<(poVar5,(string *)shopname);
          poVar5 = std::operator<<(poVar5,"] bought item, new budget ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,*budget);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
        else {
          poVar5 = std::operator<<((ostream *)&std::cout,"[T ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,buy_lock._12_4_);
          poVar5 = std::operator<<(poVar5,"] budget exhausted");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          buy_lock._11_1_ = 1;
        }
      }
      bVar1 = false;
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cout,"[T ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,buy_lock._12_4_);
      poVar5 = std::operator<<(poVar5,", ");
      poVar5 = std::operator<<(poVar5,(string *)shopname);
      poVar5 = std::operator<<(poVar5,"] timeout");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      buy_mx_local._4_4_ = 1;
      bVar1 = true;
    }
    std::unique_lock<std::timed_mutex>::~unique_lock((unique_lock<std::timed_mutex> *)local_48);
  } while (!bVar1);
  return buy_mx_local._4_4_;
}

Assistant:

int shopping(std::timed_mutex& buy_mx, shop_t& shop,
             const std::string& shopname, int& budget, const int threadid) {
  bool checkout = false;

  while (!checkout) {
    // try to buy things, but only if shop is not empty

    // be careful, erase modifies the shop, hence lock here
    std::unique_lock<std::timed_mutex> buy_lock(buy_mx, std::defer_lock);

    if (!buy_lock.try_lock_for(std::chrono::milliseconds(PATIENCE))) {
      std::cout << "[T " << threadid << ", " << shopname << "] timeout"
                << std::endl;
      return TIMEOUT;
    }

    size_t size = shop.size();
    if (size != 0) {
      auto elit = shop.begin();
      // find random product in shop
      std::advance(elit, (std::rand() % size));
      if (std::get<1>(*elit) < budget) {
        budget -= std::get<1>(*elit);

        // remove item from shop
        shop.erase(elit);
        std::cout << "[T " << threadid << ", " << shopname
                  << "] bought item, new budget " << budget << std::endl;
      } else {
        std::cout << "[T " << threadid << "] budget exhausted" << std::endl;
        checkout = true;
      }
    } else {
      std::cout << "[T " << threadid << "] no more products in this shop"
                << std::endl;
      checkout = true;
    }
  }
  return CHECKOUT;
}